

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

int WriteOptionString(TidyOptionImpl *option,ctmbstr sval,StreamOut *out)

{
  undefined1 uVar1;
  char cVar2;
  int extraout_EAX;
  char *pcVar3;
  byte *pbVar4;
  
  uVar1 = (undefined1)option->id;
  if (uVar1 != TidyUnknownOption) {
    pbVar4 = (byte *)((long)&option->id + 1);
    do {
      prvTidyWriteChar((int)(char)uVar1,out);
      uVar1 = *pbVar4;
      pbVar4 = pbVar4 + 1;
    } while (uVar1 != TidyUnknownOption);
  }
  prvTidyWriteChar(0x3a,out);
  prvTidyWriteChar(0x20,out);
  cVar2 = *sval;
  if (cVar2 != '\0') {
    pcVar3 = sval + 1;
    do {
      prvTidyWriteChar((int)cVar2,out);
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
  }
  prvTidyWriteChar(10,out);
  return extraout_EAX;
}

Assistant:

static int  WriteOptionString( const TidyOptionImpl* option,
                               ctmbstr sval, StreamOut* out )
{
  ctmbstr cp = option->name;
  while ( *cp )
      TY_(WriteChar)( *cp++, out );
  TY_(WriteChar)( ':', out );
  TY_(WriteChar)( ' ', out );
  cp = sval;
  while ( *cp )
      TY_(WriteChar)( *cp++, out );
  TY_(WriteChar)( '\n', out );
  return 0;
}